

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

void __thiscall Assimp::STEP::SyntaxError::SyntaxError(SyntaxError *this,string *s,uint64_t line)

{
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
  AddLineNumber(&local_60,s,line,&local_40);
  DeadlyImportError::DeadlyImportError(&this->super_DeadlyImportError,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_DeadlyImportError = &PTR__runtime_error_0082d4a0;
  return;
}

Assistant:

STEP::SyntaxError::SyntaxError (const std::string& s,uint64_t line /* = LINE_NOT_SPECIFIED */)
: DeadlyImportError(AddLineNumber(s,line))
{

}